

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityKirchhoffOrthotropic::ChElasticityKirchhoffOrthotropic
          (ChElasticityKirchhoffOrthotropic *this,double m_E,double m_nu)

{
  (this->super_ChElasticityKirchhoff).section = (ChMaterialShellKirchhoff *)0x0;
  (this->super_ChElasticityKirchhoff)._vptr_ChElasticityKirchhoff =
       (_func_int **)&PTR__ChElasticityKirchhoff_00b2bbd8;
  this->E_x = m_E;
  this->E_y = m_E;
  this->nu_xy = m_nu;
  this->G_xy = m_E / (m_nu + 1.0 + m_nu + 1.0);
  return;
}

Assistant:

ChElasticityKirchhoffOrthotropic::ChElasticityKirchhoffOrthotropic(    double m_E,
                                                                       double m_nu) {

    double m_G = m_E / (2. * (1. + m_nu));  // default value of G for special subcase of isotropic constructor
    this->E_x = m_E;
    this->E_y = m_E;
    this->nu_xy = m_nu;
    this->G_xy = m_G;
}